

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O1

void __thiscall gmath::Camera::Camera(Camera *this,Properties *prop,int id)

{
  double *value;
  Camera *pCVar1;
  undefined1 auVar2 [16];
  long lVar3;
  Camera *pCVar4;
  undefined1 auVar5 [16];
  undefined1 local_58 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  long lVar6;
  
  this->_vptr_Camera = (_func_int **)&PTR__Camera_00178800;
  local_38 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)local_38;
  lVar3 = 0;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->R).v[0][0] = 0.0;
  (this->R).v[0][1] = 0.0;
  (this->R).v[0][2] = 0.0;
  (this->R).v[1][0] = 0.0;
  (this->R).v[1][1] = 0.0;
  (this->R).v[1][2] = 0.0;
  (this->R).v[2][0] = 0.0;
  (this->R).v[2][1] = 0.0;
  (this->R).v[2][2] = 0.0;
  auVar2 = _DAT_00163c20;
  auVar5 = _DAT_00163c10;
  do {
    if (SUB164(auVar5 ^ auVar2,4) == -0x80000000 && SUB164(auVar5 ^ auVar2,0) < -0x7ffffffd) {
      *(undefined8 *)((long)(this->R).v[0] + lVar3) = 0x3ff0000000000000;
      *(undefined8 *)((long)(this->R).v[1] + lVar3 + 8) = 0x3ff0000000000000;
    }
    lVar6 = auVar5._8_8_;
    auVar5._0_8_ = auVar5._0_8_ + 2;
    auVar5._8_8_ = lVar6 + 2;
    lVar3 = lVar3 + 0x40;
  } while (lVar3 != 0x80);
  (this->T).v[0] = 0.0;
  (this->T).v[1] = 0.0;
  (this->T).v[2] = 0.0;
  (this->match).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->match).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->match).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getCameraKey_abi_cxx11_((string *)local_58,(Camera *)prop,"R",id);
  pCVar4 = (Camera *)local_58._0_8_;
  gutil::Properties::getValue<gmath::SMatrix<double,3,3>>
            (prop,(char *)local_58._0_8_,&this->R,"[1 0 0; 0 1 0; 0 0 1]");
  pCVar1 = (Camera *)(local_58 + 0x10);
  if ((Camera *)local_58._0_8_ != pCVar1) {
    operator_delete((void *)local_58._0_8_);
  }
  getCameraKey_abi_cxx11_((string *)local_58,pCVar4,"T",id);
  pCVar4 = (Camera *)local_58._0_8_;
  gutil::Properties::getValue<gmath::SVector<double,3>>
            (prop,(char *)local_58._0_8_,&this->T,"[0 0 0]");
  if ((Camera *)local_58._0_8_ != pCVar1) {
    operator_delete((void *)local_58._0_8_);
  }
  getCameraKey_abi_cxx11_((string *)local_58,pCVar4,"width",id);
  pCVar4 = (Camera *)local_58._0_8_;
  gutil::Properties::getValue<long>(prop,(char *)local_58._0_8_,&this->width,"0");
  if ((Camera *)local_58._0_8_ != pCVar1) {
    operator_delete((void *)local_58._0_8_);
  }
  getCameraKey_abi_cxx11_((string *)local_58,pCVar4,"height",id);
  pCVar4 = (Camera *)local_58._0_8_;
  gutil::Properties::getValue<long>(prop,(char *)local_58._0_8_,&this->height,"0");
  if ((Camera *)local_58._0_8_ != pCVar1) {
    operator_delete((void *)local_58._0_8_);
  }
  getCameraKey_abi_cxx11_((string *)local_58,pCVar4,"zmin",id);
  pCVar4 = (Camera *)local_58._0_8_;
  gutil::Properties::getValue<double>(prop,(char *)local_58._0_8_,&this->zmin,"0");
  if ((Camera *)local_58._0_8_ != pCVar1) {
    operator_delete((void *)local_58._0_8_);
  }
  getCameraKey_abi_cxx11_((string *)local_58,pCVar4,"zmax",id);
  value = &this->zmax;
  pCVar4 = (Camera *)local_58._0_8_;
  gutil::Properties::getValue<double>(prop,(char *)local_58._0_8_,value,"-1");
  if ((Camera *)local_58._0_8_ != pCVar1) {
    operator_delete((void *)local_58._0_8_);
  }
  if (*value <= 0.0 && *value != 0.0) {
    *value = 1.79769313486232e+308;
  }
  getCameraKey_abi_cxx11_((string *)local_58,pCVar4,"match",id);
  gutil::Properties::getStringVector(prop,(char *)local_58._0_8_,&this->match,"",',');
  if ((Camera *)local_58._0_8_ != pCVar1) {
    operator_delete((void *)local_58._0_8_);
  }
  return;
}

Assistant:

Camera::Camera(const gutil::Properties &prop, int id)
{
  prop.getValue(getCameraKey("R", id).c_str(), R, "[1 0 0; 0 1 0; 0 0 1]");
  prop.getValue(getCameraKey("T", id).c_str(), T, "[0 0 0]");
  prop.getValue(getCameraKey("width", id).c_str(), width, "0");
  prop.getValue(getCameraKey("height", id).c_str(), height, "0");

  prop.getValue(getCameraKey("zmin", id).c_str(), zmin, "0");
  prop.getValue(getCameraKey("zmax", id).c_str(), zmax, "-1");

  if (zmax < 0)
  {
    zmax=std::numeric_limits<double>::max();
  }

  prop.getStringVector(getCameraKey("match", id).c_str(), match, "", ',');
}